

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int ddReorderPostprocess(DdManager *table)

{
  int in_EAX;
  int extraout_EAX;
  
  if (table->interact != (long *)0x0) {
    free(table->interact);
    table->interact = (long *)0x0;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int
ddReorderPostprocess(
  DdManager * table)
{

#ifdef DD_VERBOSE
    (void) fflush(table->out);
#endif

    /* Free interaction matrix. */
    ABC_FREE(table->interact);

    return(1);

}